

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O3

IndexPointer __thiscall
duckdb::FixedSizeAllocator::VacuumPointer(FixedSizeAllocator *this,IndexPointer ptr)

{
  idx_t iVar1;
  idx_t iVar2;
  IndexPointer IVar3;
  iterator iVar4;
  pointer pFVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  ulong local_38;
  
  IVar3 = New(this);
  this->total_segment_count = this->total_segment_count - 1;
  local_38 = IVar3.data & 0xffffffff;
  iVar4 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->buffers)._M_h,&local_38);
  pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
           operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                       *)((long)iVar4.
                                super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                ._M_cur + 0x10));
  pdVar6 = FixedSizeBuffer::Get(pFVar5,true);
  iVar1 = this->segment_size;
  iVar2 = this->bitmask_offset;
  local_38 = ptr.data & 0xffffffff;
  iVar4 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->buffers)._M_h,&local_38);
  pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
           operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                       *)((long)iVar4.
                                super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                ._M_cur + 0x10));
  pdVar7 = FixedSizeBuffer::Get(pFVar5,true);
  switchD_015de399::default
            (pdVar6 + iVar2 + (IVar3.data >> 0x20 & 0xffffff) * iVar1,
             pdVar7 + this->bitmask_offset + (ptr.data >> 0x20 & 0xffffff) * this->segment_size,
             this->segment_size);
  return (IndexPointer)IVar3.data;
}

Assistant:

IndexPointer FixedSizeAllocator::VacuumPointer(const IndexPointer ptr) {
	// we do not need to adjust the bitmask of the old buffer, because we will free the entire
	// buffer after the vacuum operation

	auto new_ptr = New();
	// new increases the allocation count, we need to counter that here
	total_segment_count--;

	memcpy(Get(new_ptr), Get(ptr), segment_size);
	return new_ptr;
}